

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

void __thiscall
wallet::LegacyScriptPubKeyMan::DeriveNewChildKey
          (LegacyScriptPubKeyMan *this,WalletBatch *batch,CKeyMetadata *metadata,CKey *secret,
          CHDChain *hd_chain,bool internal)

{
  CKeyID *a;
  uint32_t *t;
  long lVar1;
  WalletStorage *pWVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  runtime_error *prVar6;
  uint index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  long in_FS_OFFSET;
  Span<const_std::byte> seed_00;
  allocator<char> local_1d1;
  CKey seed;
  CPubKey local_1c0;
  CKeyID master_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  CExtKey childKey;
  CExtKey chainChildKey;
  CExtKey accountKey;
  CExtKey masterKey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  seed.fCompressed = false;
  seed.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  masterKey.key.fCompressed = false;
  masterKey.key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  accountKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  accountKey.key.fCompressed = false;
  accountKey.key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  chainChildKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  chainChildKey.key.fCompressed = false;
  chainChildKey.key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  childKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  childKey.key.fCompressed = false;
  childKey.key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  a = &hd_chain->seed_id;
  iVar5 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1e])
                    (this,a,&seed);
  if ((char)iVar5 == '\0') {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"DeriveNewChildKey",(allocator<char> *)&master_id);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0,
                   &local_158,": seed not found");
    std::runtime_error::runtime_error(prVar6,(string *)&local_1c0);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    seed_00.m_size._0_4_ =
         (uint)((__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 )seed.keydata._M_t.
                  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
               (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                )0x0) << 5;
    seed_00.m_data =
         (byte *)seed.keydata._M_t.
                 super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
    seed_00.m_size._4_4_ = 0;
    CExtKey::SetSeed(&masterKey,seed_00);
    index = 0x80000000;
    DeriveExtKey(&masterKey,0x80000000,&accountKey);
    if (internal) {
      pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
      iVar5 = (*pWVar2->_vptr_WalletStorage[6])(pWVar2,0x2227c);
      index = 0x80000001;
      if ((char)iVar5 == '\0') {
        __assert_fail("internal ? m_storage.CanSupportFeature(FEATURE_HD_SPLIT) : true",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                      ,0x47b,
                      "void wallet::LegacyScriptPubKeyMan::DeriveNewChildKey(WalletBatch &, CKeyMetadata &, CKey &, CHDChain &, bool)"
                     );
      }
    }
    DeriveExtKey(&accountKey,index,&chainChildKey);
    this_00 = &(metadata->key_origin).path;
    t = &hd_chain->nInternalChainCounter;
    do {
      if (internal) {
        DeriveExtKey(&chainChildKey,*t | 0x80000000,&childKey);
        util::ToString<unsigned_int>((string *)&master_id,t);
        std::operator+(&local_158,"m/0\'/1\'/",(string *)&master_id);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c0,&local_158,"\'");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&metadata->hdKeypath,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&master_id);
        local_1c0.vch[0] = '\0';
        local_1c0.vch[1] = '\0';
        local_1c0.vch[2] = '\0';
        local_1c0.vch[3] = 0x80;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_00,(uint *)&local_1c0);
        local_1c0.vch[0] = '\x01';
        local_1c0.vch[1] = '\0';
        local_1c0.vch[2] = '\0';
        local_1c0.vch[3] = 0x80;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_00,(uint *)&local_1c0);
        local_1c0.vch._0_4_ = *t | 0x80000000;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_00,(uint *)&local_1c0);
        *t = *t + 1;
      }
      else {
        DeriveExtKey(&chainChildKey,hd_chain->nExternalChainCounter | 0x80000000,&childKey);
        util::ToString<unsigned_int>((string *)&master_id,&hd_chain->nExternalChainCounter);
        std::operator+(&local_158,"m/0\'/0\'/",(string *)&master_id);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c0,&local_158,"\'");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&metadata->hdKeypath,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&master_id);
        local_1c0.vch[0] = '\0';
        local_1c0.vch[1] = '\0';
        local_1c0.vch[2] = '\0';
        local_1c0.vch[3] = 0x80;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_00,(uint *)&local_1c0);
        local_1c0.vch[0] = '\0';
        local_1c0.vch[1] = '\0';
        local_1c0.vch[2] = '\0';
        local_1c0.vch[3] = 0x80;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_00,(uint *)&local_1c0);
        local_1c0.vch._0_4_ = hd_chain->nExternalChainCounter | 0x80000000;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_00,(uint *)&local_1c0);
        hd_chain->nExternalChainCounter = hd_chain->nExternalChainCounter + 1;
      }
      CKey::GetPubKey(&local_1c0,&childKey.key);
      CPubKey::GetID((CKeyID *)&local_158,&local_1c0);
      iVar5 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1d])
                        (this,&local_158);
    } while ((char)iVar5 != '\0');
    CKey::operator=(secret,&childKey.key);
    *(undefined4 *)
     ((metadata->hd_seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 0x10) =
         *(undefined4 *)
          ((hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 0x10);
    uVar3 = *(undefined8 *)
             ((hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 8);
    *(undefined8 *)(metadata->hd_seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems =
         *(undefined8 *)(a->super_uint160).super_base_blob<160U>.m_data._M_elems;
    *(undefined8 *)((metadata->hd_seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 8)
         = uVar3;
    CKey::GetPubKey(&local_1c0,&masterKey.key);
    CPubKey::GetID(&master_id,&local_1c0);
    *(undefined4 *)(metadata->key_origin).fingerprint =
         master_id.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_;
    metadata->has_key_origin = true;
    bVar4 = ::operator==((base_blob<160U> *)a,
                         (base_blob<160U> *)&(this->super_LegacyDataSPKM).m_hd_chain.seed_id);
    if (bVar4) {
      bVar4 = WalletBatch::WriteHDChain(batch,hd_chain);
      if (!bVar4) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"DeriveNewChildKey",&local_1d1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c0,&local_158,": writing HD chain model failed");
        std::runtime_error::runtime_error(prVar6,(string *)&local_1c0);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0042bb66;
      }
    }
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(&childKey.key.keydata);
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(&chainChildKey.key.keydata);
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(&accountKey.key.keydata);
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(&masterKey.key.keydata);
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(&seed.keydata);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
LAB_0042bb66:
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::DeriveNewChildKey(WalletBatch &batch, CKeyMetadata& metadata, CKey& secret, CHDChain& hd_chain, bool internal)
{
    // for now we use a fixed keypath scheme of m/0'/0'/k
    CKey seed;                     //seed (256bit)
    CExtKey masterKey;             //hd master key
    CExtKey accountKey;            //key at m/0'
    CExtKey chainChildKey;         //key at m/0'/0' (external) or m/0'/1' (internal)
    CExtKey childKey;              //key at m/0'/0'/<n>'

    // try to get the seed
    if (!GetKey(hd_chain.seed_id, seed))
        throw std::runtime_error(std::string(__func__) + ": seed not found");

    masterKey.SetSeed(seed);

    // derive m/0'
    // use hardened derivation (child keys >= 0x80000000 are hardened after bip32)
    DeriveExtKey(masterKey, BIP32_HARDENED_KEY_LIMIT, accountKey);

    // derive m/0'/0' (external chain) OR m/0'/1' (internal chain)
    assert(internal ? m_storage.CanSupportFeature(FEATURE_HD_SPLIT) : true);
    DeriveExtKey(accountKey, BIP32_HARDENED_KEY_LIMIT+(internal ? 1 : 0), chainChildKey);

    // derive child key at next index, skip keys already known to the wallet
    do {
        // always derive hardened keys
        // childIndex | BIP32_HARDENED_KEY_LIMIT = derive childIndex in hardened child-index-range
        // example: 1 | BIP32_HARDENED_KEY_LIMIT == 0x80000001 == 2147483649
        if (internal) {
            DeriveExtKey(chainChildKey, hd_chain.nInternalChainCounter | BIP32_HARDENED_KEY_LIMIT, childKey);
            metadata.hdKeypath = "m/0'/1'/" + ToString(hd_chain.nInternalChainCounter) + "'";
            metadata.key_origin.path.push_back(0 | BIP32_HARDENED_KEY_LIMIT);
            metadata.key_origin.path.push_back(1 | BIP32_HARDENED_KEY_LIMIT);
            metadata.key_origin.path.push_back(hd_chain.nInternalChainCounter | BIP32_HARDENED_KEY_LIMIT);
            hd_chain.nInternalChainCounter++;
        }
        else {
            DeriveExtKey(chainChildKey, hd_chain.nExternalChainCounter | BIP32_HARDENED_KEY_LIMIT, childKey);
            metadata.hdKeypath = "m/0'/0'/" + ToString(hd_chain.nExternalChainCounter) + "'";
            metadata.key_origin.path.push_back(0 | BIP32_HARDENED_KEY_LIMIT);
            metadata.key_origin.path.push_back(0 | BIP32_HARDENED_KEY_LIMIT);
            metadata.key_origin.path.push_back(hd_chain.nExternalChainCounter | BIP32_HARDENED_KEY_LIMIT);
            hd_chain.nExternalChainCounter++;
        }
    } while (HaveKey(childKey.key.GetPubKey().GetID()));
    secret = childKey.key;
    metadata.hd_seed_id = hd_chain.seed_id;
    CKeyID master_id = masterKey.key.GetPubKey().GetID();
    std::copy(master_id.begin(), master_id.begin() + 4, metadata.key_origin.fingerprint);
    metadata.has_key_origin = true;
    // update the chain model in the database
    if (hd_chain.seed_id == m_hd_chain.seed_id && !batch.WriteHDChain(hd_chain))
        throw std::runtime_error(std::string(__func__) + ": writing HD chain model failed");
}